

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

void __thiscall booster::locale::calendar::calendar(calendar *this,string *zone)

{
  pointer pcVar1;
  calendar_facet *pcVar2;
  abstract_calendar *paVar3;
  locale lStack_28;
  
  std::locale::locale(&this->locale_);
  (this->tz_)._M_dataplus._M_p = (pointer)&(this->tz_).field_2;
  pcVar1 = (zone->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tz_,pcVar1,pcVar1 + zone->_M_string_length);
  std::locale::locale(&lStack_28);
  pcVar2 = std::use_facet<booster::locale::calendar_facet>(&lStack_28);
  paVar3 = (abstract_calendar *)(**(code **)(*(long *)pcVar2 + 0x10))(pcVar2);
  (this->impl_).ptr_ = paVar3;
  std::locale::~locale(&lStack_28);
  paVar3 = (this->impl_).ptr_;
  (*paVar3->_vptr_abstract_calendar[10])(paVar3,&this->tz_);
  return;
}

Assistant:

calendar::calendar(std::string const &zone) :
    tz_(zone),
    impl_(std::use_facet<calendar_facet>(std::locale()).create_calendar())
{
    impl_->set_timezone(tz_);
}